

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

uint __thiscall EOPlus::Parser::ParseVersion(Parser *this)

{
  Parser_Token_Server_Base *pPVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  runtime_error *prVar5;
  long *plVar6;
  size_type *psVar7;
  Token *t_00;
  Token *t_01;
  int iVar8;
  uint uVar9;
  Token t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  undefined1 local_160 [24];
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  bool local_128;
  bool bStack_127;
  bool bStack_126;
  bool bStack_125;
  bool bStack_124;
  undefined3 uStack_123;
  var_type local_120;
  int local_118;
  variant local_110;
  Token local_d0;
  Token local_80;
  
  util::variant::variant(&local_110);
  local_160._0_4_ = Invalid;
  local_160._8_4_ = local_110.val_int;
  local_160._12_4_ = local_110._4_4_;
  local_160._16_4_ = local_110.val_float._0_4_;
  local_160._20_4_ = local_110.val_float._4_4_;
  local_148._M_p = (pointer)&local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_110.val_string._M_dataplus._M_p,
             local_110.val_string._M_dataplus._M_p + local_110.val_string._M_string_length);
  local_120 = local_110.type;
  local_128 = local_110.val_bool;
  bStack_127 = local_110.cache_val[0];
  bStack_126 = local_110.cache_val[1];
  bStack_125 = local_110.cache_val[2];
  bStack_124 = local_110.cache_val[3];
  uStack_123 = local_110._53_3_;
  local_118 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.val_string._M_dataplus._M_p != &local_110.val_string.field_2) {
    operator_delete(local_110.val_string._M_dataplus._M_p,
                    local_110.val_string.field_2._M_allocated_capacity + 1);
  }
  bVar2 = GetToken(this,(Token *)local_160,4);
  if (bVar2) {
    iVar3 = util::variant::GetInt((variant *)(local_160 + 8));
    local_188._M_unused._M_object = (void *)0x0;
    local_188._8_8_ = 0;
    local_170 = std::
                _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:151:28)>
                ::_M_invoke;
    local_178 = std::
                _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:151:28)>
                ::_M_manager;
    bVar2 = GetTokenIf(this,(Token *)local_160,(function<bool_(const_EOPlus::Token_&)> *)&local_188,
                       0x40);
    if (local_178 != (code *)0x0) {
      (*local_178)(&local_188,&local_188,__destroy_functor);
    }
    uVar9 = iVar3 << 0x10;
    if (bVar2) {
      bVar2 = GetToken(this,(Token *)local_160,4);
      if (!bVar2) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x18);
        local_1e8[0] = local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"Expected number after \'.\' in version.","");
        plVar6 = (long *)std::__cxx11::string::append((char *)local_1e8);
        local_208._M_dataplus._M_p = (pointer)*plVar6;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_208._M_dataplus._M_p == psVar7) {
          local_208.field_2._M_allocated_capacity = *psVar7;
          local_208.field_2._8_8_ = plVar6[3];
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar7;
        }
        local_208._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        Parser_Token_Server_Base::RejectToken
                  (&local_80,
                   (this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl);
        token_got_string_abi_cxx11_(&local_1c8,(EOPlus *)&local_80,t_01);
        std::operator+(&local_1a8,&local_208,&local_1c8);
        pPVar1 = (this->tok)._M_t.
                 super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
        iVar3 = pPVar1->line;
        iVar8 = pPVar1->reject_line;
        std::runtime_error::runtime_error(prVar5,(string *)&local_1a8);
        if (iVar8 < iVar3) {
          iVar8 = iVar3;
        }
        *(int *)(prVar5 + 0x10) = iVar8;
        *(undefined ***)prVar5 = &PTR__runtime_error_001d37c8;
        __cxa_throw(prVar5,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar4 = util::variant::GetInt((variant *)(local_160 + 8));
      uVar9 = uVar9 | uVar4 & 0xffff;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_p != &local_138) {
      operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
    }
    return uVar9;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x18);
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"Expected number after \'version\'","");
  plVar6 = (long *)std::__cxx11::string::append((char *)local_1e8);
  local_208._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_208._M_dataplus._M_p == psVar7) {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208.field_2._8_8_ = plVar6[3];
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar7;
  }
  local_208._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  Parser_Token_Server_Base::RejectToken
            (&local_d0,
             (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl);
  token_got_string_abi_cxx11_(&local_1c8,(EOPlus *)&local_d0,t_00);
  std::operator+(&local_1a8,&local_208,&local_1c8);
  pPVar1 = (this->tok)._M_t.
           super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ._M_t.
           super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
  iVar3 = pPVar1->line;
  iVar8 = pPVar1->reject_line;
  std::runtime_error::runtime_error(prVar5,(string *)&local_1a8);
  if (iVar8 < iVar3) {
    iVar8 = iVar3;
  }
  *(int *)(prVar5 + 0x10) = iVar8;
  *(undefined ***)prVar5 = &PTR__runtime_error_001d37c8;
  __cxa_throw(prVar5,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unsigned int Parser::ParseVersion()
	{
		typedef unsigned int ui;
		unsigned int version = 0;
		Token t;

		if (this->GetToken(t, Token::Integer))
		{
			version += ui(int(t.data)) << 16;

			if (this->GetTokenIf(t, [](const Token& t) { return std::string(t.data) == "."; }, Token::Symbol))
			{
				if (this->GetToken(t, Token::Integer))
					version |= ui(int(t.data)) & 0xFFFF;
				else
					PARSER_ERROR_GOT("Expected number after '.' in version.");
			}
		}
		else
		{
			PARSER_ERROR_GOT("Expected number after 'version'");
		}

		return version;
	}